

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.c
# Opt level: O0

int matras_allocator_reserve(matras_allocator *allocator,int count)

{
  undefined8 *puVar1;
  void *ext;
  int count_local;
  matras_allocator *allocator_local;
  
  if (count < 0) {
    __assert_fail("count >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/matras.c"
                  ,0x243,"int matras_allocator_reserve(struct matras_allocator *, int)");
  }
  while( true ) {
    if (count <= allocator->num_reserved_extents) {
      return 0;
    }
    puVar1 = (undefined8 *)(*allocator->alloc_func)(allocator);
    if (puVar1 == (undefined8 *)0x0) break;
    *puVar1 = allocator->reserved_extents;
    allocator->reserved_extents = puVar1;
    allocator->num_reserved_extents = allocator->num_reserved_extents + 1;
  }
  return -1;
}

Assistant:

int
matras_allocator_reserve(struct matras_allocator *allocator, int count)
{
	assert(count >= 0);
	while (allocator->num_reserved_extents < count) {
		void *ext = allocator->alloc_func(allocator);
		if (ext == NULL)
			return -1;
		*(void **)ext = allocator->reserved_extents;
		allocator->reserved_extents = ext;
		allocator->num_reserved_extents++;
	}
	return 0;
}